

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

_Bool floor_carry(chunk *c,loc_conflict grid,object *drop,_Bool *note)

{
  long lVar1;
  _Bool _Var2;
  loc lVar3;
  chunk *local_60;
  chunk *p_c;
  object *ignore;
  object *obj;
  _Bool *p_Stack_30;
  wchar_t n;
  _Bool *note_local;
  object *drop_local;
  chunk *c_local;
  wchar_t wStack_10;
  loc_conflict grid_local;
  
  obj._4_4_ = 0;
  p_Stack_30 = note;
  note_local = (_Bool *)drop;
  drop_local = (object *)c;
  unique0x1000020d = grid;
  p_c = (chunk *)floor_get_oldest_ignored(player,c,grid);
  _Var2 = square_isobjectholding((chunk *)drop_local,stack0xffffffffffffffec);
  if (_Var2) {
    for (ignore = square_object((chunk *)drop_local,stack0xffffffffffffffec);
        ignore != (object *)0x0; ignore = ignore->next) {
      _Var2 = object_mergeable(ignore,(object *)note_local,OSTACK_FLOOR);
      if (_Var2) {
        object_absorb(ignore,(object *)note_local);
        _Var2 = square_isview((chunk *)drop_local,stack0xffffffffffffffec);
        if (_Var2) {
          square_note_spot((chunk *)drop_local,(loc)stack0xffffffffffffffec);
        }
        _Var2 = ignore_item_ok(player,ignore);
        if (_Var2) {
          *p_Stack_30 = false;
        }
        return true;
      }
      obj._4_4_ = obj._4_4_ + 1;
    }
    if (((int)(uint)z_info->floor_size <= obj._4_4_) ||
       ((((player->opts).opt[0x22] & 1U) == 0 && (obj._4_4_ != 0)))) {
      if (p_c == (chunk *)0x0) {
        return false;
      }
      if (drop_local == (object *)cave) {
        local_60 = (chunk *)player->cave;
      }
      else {
        local_60 = (chunk *)0x0;
      }
      square_excise_object((chunk *)drop_local,stack0xffffffffffffffec,(object *)p_c);
      delist_object((chunk_conflict *)drop_local,(object *)p_c);
      object_delete((chunk *)drop_local,local_60,(object **)&p_c);
    }
    *(loc_conflict *)(note_local + 0x34) = stack0xffffffffffffffec;
    note_local[300] = false;
    note_local[0x12d] = false;
    pile_insert((object **)
                (*(long *)(*(long *)&(drop_local->grid).y + (long)wStack_10 * 8) +
                 (long)c_local._4_4_ * 0x28 + 0x18),(object *)note_local);
    list_object((chunk_conflict *)drop_local,(object *)note_local);
    if (*(long *)(note_local + 0x28) != 0) {
      *(undefined2 *)(*(long *)(note_local + 0x28) + 0x30) = *(undefined2 *)(note_local + 0x30);
      *(undefined2 *)(*(long *)(note_local + 0x28) + 300) = 0;
      lVar1 = *(long *)(note_local + 0x28);
      lVar3 = loc(0,0);
      *(loc *)(lVar1 + 0x34) = lVar3;
      player->cave->objects[*(ushort *)(note_local + 0x30)] = *(object **)(note_local + 0x28);
    }
    square_note_spot((chunk *)drop_local,(loc)stack0xffffffffffffffec);
    square_light_spot((chunk *)drop_local,(loc)stack0xffffffffffffffec);
    _Var2 = ignore_item_ok(player,(object *)note_local);
    if (_Var2) {
      *p_Stack_30 = false;
    }
    grid_local.x._3_1_ = true;
  }
  else {
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

bool floor_carry(struct chunk *c, struct loc grid, struct object *drop,
				 bool *note)
{
	int n = 0;
	struct object *obj, *ignore = floor_get_oldest_ignored(player, c, grid);

	/* Fail if the square can't hold objects */
	if (!square_isobjectholding(c, grid))
		return false;

	/* Scan objects in that grid for combination */
	for (obj = square_object(c, grid); obj; obj = obj->next) {
		/* Check for combination */
		if (object_mergeable(obj, drop, OSTACK_FLOOR)) {
			/* Combine the items */
			object_absorb(obj, drop);

			/* Note the pile */
			if (square_isview(c, grid)) {
				square_note_spot(c, grid);
			}

			/* Don't mention if ignored */
			if (ignore_item_ok(player, obj)) {
				*note = false;
			}

			/* Result */
			return true;
		}

		/* Count objects */
		n++;
	}

	/* The stack is already too large */
	if (n >= z_info->floor_size || (!OPT(player, birth_stacking) && n)) {
		/* Delete the oldest ignored object */
		if (ignore) {
			struct chunk *p_c = (c == cave) ? player->cave : NULL;
			square_excise_object(c, grid, ignore);
			delist_object(c, ignore);
			object_delete(c, p_c, &ignore);
		} else {
			return false;
		}
	}

	/* Location */
	drop->grid = grid;

	/* Forget monster */
	drop->held_m_idx = 0;

	/* Link to the first object in the pile */
	pile_insert(&c->squares[grid.y][grid.x].obj, drop);

	/* Record in the level list */
	list_object(c, drop);

	/* If there's a known version, put it in the player's view of the
	 * cave but at an unknown location.  square_note_spot() will move
	 * it to the correct place if seen. */
	if (drop->known) {
		drop->known->oidx = drop->oidx;
		drop->known->held_m_idx = 0;
		drop->known->grid = loc(0, 0);
		player->cave->objects[drop->oidx] = drop->known;
	}

	/* Redraw */
	square_note_spot(c, grid);
	square_light_spot(c, grid);

	/* Don't mention if ignored */
	if (ignore_item_ok(player, drop)) {
		*note = false;
	}

	/* Result */
	return true;
}